

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O2

void __thiscall deqp::gles3::Functional::DeleteShaderCase::test(DeleteShaderCase *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLboolean GVar2;
  GLenum err;
  TestError *this_01;
  
  (*(this->super_SimpleProgramCase).super_ApiCase.super_TestCase.super_TestCase.super_TestNode.
    _vptr_TestNode[6])();
  SimpleProgramCase::linkProgram(&this->super_SimpleProgramCase);
  this_00 = &(this->super_SimpleProgramCase).super_ApiCase.super_CallLogWrapper;
  err = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(err,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderApiTests.cpp"
                  ,0x21a);
  deleteShaders(this);
  bVar1 = checkDeleteStatus(this,(this->super_SimpleProgramCase).m_vertShader);
  if (bVar1) {
    bVar1 = checkDeleteStatus(this,(this->super_SimpleProgramCase).m_fragShader);
    if (bVar1) {
      glu::CallLogWrapper::glDeleteProgram(this_00,(this->super_SimpleProgramCase).m_program);
      GVar2 = glu::CallLogWrapper::glIsShader(this_00,(this->super_SimpleProgramCase).m_vertShader);
      if (GVar2 == '\0') {
        GVar2 = glu::CallLogWrapper::glIsShader
                          (this_00,(this->super_SimpleProgramCase).m_fragShader);
        if (GVar2 == '\0') {
          return;
        }
      }
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,(char *)0x0,"!(glIsShader(m_vertShader) || glIsShader(m_fragShader))",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderApiTests.cpp"
                 ,0x222);
      goto LAB_00f87cac;
    }
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,(char *)0x0,
             "checkDeleteStatus(m_vertShader) && checkDeleteStatus(m_fragShader)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderApiTests.cpp"
             ,0x21e);
LAB_00f87cac:
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void test (void)
	{
		compileShaders();
		linkProgram();
		GLU_CHECK();

		deleteShaders();

		TCU_CHECK(checkDeleteStatus(m_vertShader) && checkDeleteStatus(m_fragShader));

		glDeleteProgram(m_program);

		TCU_CHECK(!(glIsShader(m_vertShader) || glIsShader(m_fragShader)));
	}